

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FirstMatchSequenceExprSyntax *pFVar1;
  Token TVar2;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  SequenceMatchListSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::SequenceExprSyntax_*>::operator*
            ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x592d20);
  deepClone<slang::syntax::SequenceExprSyntax>
            ((SequenceExprSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((((SequenceExprSyntax *)((long)__fn + 0x30))->super_SyntaxNode).previewNode !=
      (SyntaxNode *)0x0) {
    deepClone<slang::syntax::SequenceMatchListSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::FirstMatchSequenceExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(SequenceExprSyntax *)__fn,
                      (SequenceMatchListSyntax **)__child_stack,args_4);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const FirstMatchSequenceExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<FirstMatchSequenceExprSyntax>(
        node.first_match.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<SequenceExprSyntax>(*node.expr, alloc),
        node.matchList ? deepClone(*node.matchList, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}